

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnn2int8.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char *__filename;
  int *piVar1;
  size_type sVar2;
  int iVar3;
  FILE *__stream;
  char *pcVar4;
  char *pcVar5;
  size_t sVar6;
  mapped_type *pmVar7;
  bool bVar8;
  value_type *__val;
  void *in_R8;
  char *binpath;
  float scale;
  vector<float,_std::allocator<float>_> scales;
  string key_str;
  NetQuantize quantizer;
  char key [256];
  float local_32c;
  float *local_328;
  undefined4 uStack_320;
  undefined4 uStack_31c;
  undefined4 local_318;
  undefined4 uStack_314;
  undefined4 local_310;
  long *local_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined4 local_2f0;
  long local_2e8;
  Mat local_2d8;
  float *local_288;
  iterator iStack_280;
  float *local_278;
  char *local_268;
  FILE *local_260;
  key_type local_258;
  char *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  NetQuantize local_210;
  DataReader local_138 [33];
  
  if (argc != 6) {
    main_cold_1();
    return -1;
  }
  local_220 = argv[1];
  pcVar4 = argv[2];
  pcVar5 = argv[3];
  binpath = argv[4];
  __filename = argv[5];
  ModelWriter::ModelWriter(&local_210.super_ModelWriter);
  local_210.super_ModelWriter.super_Net._vptr_Net = (_func_int **)&PTR__NetQuantize_005bda40;
  local_210.blob_int8scale_table._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_210.blob_int8scale_table._M_t._M_impl.super__Rb_tree_header._M_header;
  local_210.blob_int8scale_table._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_210.blob_int8scale_table._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_210.blob_int8scale_table._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_210.weight_int8scale_table._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_210.weight_int8scale_table._M_t._M_impl.super__Rb_tree_header._M_header;
  local_210.weight_int8scale_table._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_210.weight_int8scale_table._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_210.weight_int8scale_table._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_210.blob_int8scale_table._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_210.blob_int8scale_table._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_210.weight_int8scale_table._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_210.weight_int8scale_table._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (__filename != (char *)0x0) {
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
    ::clear(&local_210.blob_int8scale_table._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
    ::clear(&local_210.weight_int8scale_table._M_t);
    __stream = fopen(__filename,"rb");
    if (__stream == (FILE *)0x0) {
      fprintf(_stderr,"Open %s failed.\n",__filename);
    }
    else {
      local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
      local_258._M_string_length = 0;
      local_258.field_2._M_local_buf[0] = '\0';
      local_278 = (float *)0x0;
      local_288 = (float *)0x0;
      iStack_280._M_current = (float *)0x0;
      local_260 = __stream;
      local_238 = pcVar4;
      local_230 = binpath;
      local_228 = pcVar5;
      pcVar4 = (char *)operator_new(0x9c4000);
      memset(pcVar4,0,0x9c4000);
      local_268 = pcVar4;
      do {
        __stream = local_260;
        iVar3 = feof(local_260);
        if ((iVar3 != 0) || (pcVar5 = fgets(pcVar4,0x9c4000,__stream), pcVar5 == (char *)0x0))
        break;
        local_32c = 1.0;
        sVar6 = strcspn(pcVar4,"\r\n");
        pcVar4[sVar6] = '\0';
        pcVar5 = strtok(pcVar4," ");
        __stream = local_260;
        if (pcVar5 == (char *)0x0) break;
        bVar8 = true;
        local_218 = pcVar5;
        do {
          if (bVar8) {
            bVar8 = false;
            __isoc99_sscanf(pcVar5,"%255s",local_138);
            sVar2 = local_258._M_string_length;
            in_R8 = (void *)strlen((char *)local_138);
            std::__cxx11::string::_M_replace((ulong)&local_258,0,(char *)sVar2,(ulong)local_138);
          }
          else {
            __isoc99_sscanf(pcVar5,"%f",&local_32c);
            if (iStack_280._M_current == local_278) {
              std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                        ((vector<float,std::allocator<float>> *)&local_288,iStack_280,&local_32c);
            }
            else {
              *iStack_280._M_current = local_32c;
              iStack_280._M_current = iStack_280._M_current + 1;
            }
          }
          pcVar5 = strtok((char *)0x0," ");
        } while (pcVar5 != (char *)0x0);
        pcVar5 = strstr(local_258._M_dataplus._M_p,"_param_");
        pcVar4 = local_268;
        if (pcVar5 == (char *)0x0) {
          local_328 = local_288;
          uStack_320 = 0;
          uStack_31c = 0;
          local_318 = 4;
          uStack_314 = 0;
          local_310 = 1;
          local_308 = (long *)0x0;
          iVar3 = (int)((ulong)((long)iStack_280._M_current - (long)local_288) >> 2);
          local_300 = CONCAT44(iVar3,1);
          uStack_2f8 = 0x100000001;
          local_2f0 = 1;
          local_2e8 = (long)iVar3;
          ncnn::Mat::clone(&local_2d8,(__fn *)&local_328,(void *)0x0,iVar3,in_R8);
          pmVar7 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
                   ::operator[](&local_210.blob_int8scale_table,&local_258);
          if (pmVar7 != &local_2d8) {
            piVar1 = (int *)CONCAT44(local_2d8.refcount._4_4_,local_2d8.refcount._0_4_);
            if (piVar1 != (int *)0x0) {
              LOCK();
              *piVar1 = *piVar1 + 1;
              UNLOCK();
            }
            piVar1 = pmVar7->refcount;
            if (piVar1 != (int *)0x0) {
              LOCK();
              *piVar1 = *piVar1 + -1;
              UNLOCK();
              if (*piVar1 == 0) {
                if (pmVar7->allocator == (Allocator *)0x0) {
                  if (pmVar7->data != (void *)0x0) {
                    free(pmVar7->data);
                  }
                }
                else {
                  (*pmVar7->allocator->_vptr_Allocator[3])();
                }
              }
            }
            pmVar7->cstep = 0;
            pmVar7->data = (void *)0x0;
            pmVar7->refcount = (int *)0x0;
            *(undefined8 *)((long)&pmVar7->refcount + 4) = 0;
            *(undefined8 *)((long)&pmVar7->elemsize + 4) = 0;
            pmVar7->dims = 0;
            pmVar7->w = 0;
            pmVar7->h = 0;
            pmVar7->d = 0;
            pmVar7->c = 0;
            pmVar7->data = local_2d8.data;
            pmVar7->refcount = (int *)CONCAT44(local_2d8.refcount._4_4_,local_2d8.refcount._0_4_);
            pmVar7->elemsize = CONCAT44(local_2d8.elemsize._4_4_,(undefined4)local_2d8.elemsize);
            pmVar7->elempack = local_2d8.elempack;
            pmVar7->allocator = local_2d8.allocator;
            pmVar7->dims = local_2d8.dims;
            pmVar7->w = local_2d8.w;
            pmVar7->h = local_2d8.h;
            pmVar7->d = local_2d8.d;
            pmVar7->c = local_2d8.c;
            pmVar7->cstep = local_2d8.cstep;
          }
          piVar1 = (int *)CONCAT44(local_2d8.refcount._4_4_,local_2d8.refcount._0_4_);
          if (piVar1 != (int *)0x0) {
            LOCK();
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (*piVar1 == 0) {
              if (local_2d8.allocator == (Allocator *)0x0) {
                if (local_2d8.data != (void *)0x0) {
                  free(local_2d8.data);
                }
              }
              else {
                (*(local_2d8.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          local_2d8.cstep = 0;
          local_2d8.data = (void *)0x0;
          local_2d8.refcount._0_4_ = 0;
          local_2d8.refcount._4_4_ = 0;
          local_2d8.elemsize._0_4_ = 0;
          local_2d8.elemsize._4_4_ = 0;
          local_2d8.elempack = 0;
          local_2d8.dims = 0;
          local_2d8.w = 0;
          local_2d8.h = 0;
          local_2d8.d = 0;
          local_2d8.c = 0;
          piVar1 = (int *)CONCAT44(uStack_31c,uStack_320);
          if (piVar1 != (int *)0x0) {
            LOCK();
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (*piVar1 == 0) {
              if (local_308 == (long *)0x0) goto LAB_00166a8e;
              (**(code **)(*local_308 + 0x18))();
            }
          }
        }
        else {
          local_328 = local_288;
          uStack_320 = 0;
          uStack_31c = 0;
          local_318 = 4;
          uStack_314 = 0;
          local_310 = 1;
          local_308 = (long *)0x0;
          iVar3 = (int)((ulong)((long)iStack_280._M_current - (long)local_288) >> 2);
          local_300 = CONCAT44(iVar3,1);
          uStack_2f8 = 0x100000001;
          local_2f0 = 1;
          local_2e8 = (long)iVar3;
          ncnn::Mat::clone(&local_2d8,(__fn *)&local_328,(void *)0x0,iVar3,in_R8);
          pmVar7 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
                   ::operator[](&local_210.weight_int8scale_table,&local_258);
          if (pmVar7 != &local_2d8) {
            piVar1 = (int *)CONCAT44(local_2d8.refcount._4_4_,local_2d8.refcount._0_4_);
            if (piVar1 != (int *)0x0) {
              LOCK();
              *piVar1 = *piVar1 + 1;
              UNLOCK();
            }
            piVar1 = pmVar7->refcount;
            if (piVar1 != (int *)0x0) {
              LOCK();
              *piVar1 = *piVar1 + -1;
              UNLOCK();
              if (*piVar1 == 0) {
                if (pmVar7->allocator == (Allocator *)0x0) {
                  if (pmVar7->data != (void *)0x0) {
                    free(pmVar7->data);
                  }
                }
                else {
                  (*pmVar7->allocator->_vptr_Allocator[3])();
                }
              }
            }
            pmVar7->cstep = 0;
            pmVar7->data = (void *)0x0;
            pmVar7->refcount = (int *)0x0;
            *(undefined8 *)((long)&pmVar7->refcount + 4) = 0;
            *(undefined8 *)((long)&pmVar7->elemsize + 4) = 0;
            pmVar7->dims = 0;
            pmVar7->w = 0;
            pmVar7->h = 0;
            pmVar7->d = 0;
            pmVar7->c = 0;
            pmVar7->data = local_2d8.data;
            pmVar7->refcount = (int *)CONCAT44(local_2d8.refcount._4_4_,local_2d8.refcount._0_4_);
            pmVar7->elemsize = CONCAT44(local_2d8.elemsize._4_4_,(undefined4)local_2d8.elemsize);
            pmVar7->elempack = local_2d8.elempack;
            pmVar7->allocator = local_2d8.allocator;
            pmVar7->dims = local_2d8.dims;
            pmVar7->w = local_2d8.w;
            pmVar7->h = local_2d8.h;
            pmVar7->d = local_2d8.d;
            pmVar7->c = local_2d8.c;
            pmVar7->cstep = local_2d8.cstep;
          }
          piVar1 = (int *)CONCAT44(local_2d8.refcount._4_4_,local_2d8.refcount._0_4_);
          if (piVar1 != (int *)0x0) {
            LOCK();
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (*piVar1 == 0) {
              if (local_2d8.allocator == (Allocator *)0x0) {
                if (local_2d8.data != (void *)0x0) {
                  free(local_2d8.data);
                }
              }
              else {
                (*(local_2d8.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          local_2d8.cstep = 0;
          local_2d8.data = (void *)0x0;
          local_2d8.refcount._0_4_ = 0;
          local_2d8.refcount._4_4_ = 0;
          local_2d8.elemsize._0_4_ = 0;
          local_2d8.elemsize._4_4_ = 0;
          local_2d8.elempack = 0;
          local_2d8.dims = 0;
          local_2d8.w = 0;
          local_2d8.h = 0;
          local_2d8.d = 0;
          local_2d8.c = 0;
          piVar1 = (int *)CONCAT44(uStack_31c,uStack_320);
          if (piVar1 != (int *)0x0) {
            LOCK();
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (*piVar1 == 0) {
              if (local_308 == (long *)0x0) {
LAB_00166a8e:
                local_2d8.cstep = 0;
                local_2d8.c = 0;
                local_2d8.h = 0;
                local_2d8.d = 0;
                local_2d8.dims = 0;
                local_2d8.w = 0;
                local_2d8.elempack = 0;
                local_2d8.elemsize._4_4_ = 0;
                local_2d8.elemsize._0_4_ = 0;
                local_2d8.refcount._4_4_ = 0;
                local_2d8.refcount._0_4_ = 0;
                local_2d8.data = (void *)0x0;
                if (local_328 != (float *)0x0) {
                  free(local_328);
                }
              }
              else {
                (**(code **)(*local_308 + 0x18))();
              }
            }
          }
        }
        local_2e8 = 0;
        local_328 = (float *)0x0;
        uStack_320 = 0;
        uStack_31c = 0;
        local_318 = 0;
        uStack_314 = 0;
        local_310 = 0;
        local_300 = 0;
        uStack_2f8 = 0;
        local_2f0 = 0;
        local_258._M_string_length = 0;
        *local_258._M_dataplus._M_p = '\0';
        if (iStack_280._M_current != local_288) {
          iStack_280._M_current = local_288;
        }
        __stream = local_260;
      } while (local_218 != (char *)0x0);
      fclose(__stream);
      operator_delete(pcVar4);
      if (local_288 != (float *)0x0) {
        operator_delete(local_288);
      }
      pcVar5 = local_228;
      binpath = local_230;
      pcVar4 = local_238;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p);
      }
    }
    if (__stream == (FILE *)0x0) {
      main_cold_2();
      iVar3 = -1;
      goto LAB_00166c4b;
    }
  }
  ncnn::Net::load_param((Net *)&local_210,local_220);
  iVar3 = strcmp(pcVar4,"null");
  if (iVar3 == 0) {
    ncnn::DataReader::DataReader(local_138);
    local_138[0]._vptr_DataReader = (_func_int **)&PTR__DataReader_005bdb50;
    ncnn::Net::load_model((Net *)&local_210,local_138);
    local_210.super_ModelWriter.gen_random_weight = 1;
    ncnn::DataReader::~DataReader(local_138);
  }
  else {
    ncnn::Net::load_model((Net *)&local_210,pcVar4);
  }
  NetQuantize::quantize_convolution(&local_210);
  NetQuantize::quantize_convolutiondepthwise(&local_210);
  NetQuantize::quantize_innerproduct(&local_210);
  NetQuantize::fuse_requantize(&local_210);
  iVar3 = 0;
  ModelWriter::save(&local_210.super_ModelWriter,pcVar5,binpath);
LAB_00166c4b:
  local_210.super_ModelWriter.super_Net._vptr_Net = (_func_int **)&PTR__NetQuantize_005bda40;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
  ::~_Rb_tree(&local_210.weight_int8scale_table._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
  ::~_Rb_tree(&local_210.blob_int8scale_table._M_t);
  ncnn::Net::~Net((Net *)&local_210);
  return iVar3;
}

Assistant:

int main(int argc, char** argv)
{
    if (argc != 6)
    {
        fprintf(stderr, "usage: %s [inparam] [inbin] [outparam] [outbin] [calibration table]\n", argv[0]);
        return -1;
    }

    const char* inparam = argv[1];
    const char* inbin = argv[2];
    const char* outparam = argv[3];
    const char* outbin = argv[4];
    const char* int8scale_table_path = argv[5];

    NetQuantize quantizer;

    // parse the calibration scale table
    if (int8scale_table_path)
    {
        bool s2 = read_int8scale_table(int8scale_table_path, quantizer.blob_int8scale_table, quantizer.weight_int8scale_table);
        if (!s2)
        {
            fprintf(stderr, "read_int8scale_table failed\n");
            return -1;
        }
    }

    quantizer.load_param(inparam);
    if (strcmp(inbin, "null") == 0)
    {
        DataReaderFromEmpty dr;
        quantizer.load_model(dr);
        quantizer.gen_random_weight = true;
    }
    else
        quantizer.load_model(inbin);

    quantizer.quantize_convolution();
    quantizer.quantize_convolutiondepthwise();
    quantizer.quantize_innerproduct();

    quantizer.fuse_requantize();

    quantizer.save(outparam, outbin);

    return 0;
}